

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O2

uint32 Js::ArrayBuffer::ToIndex
                 (Var value,int32 errorCode,ScriptContext *scriptContext,uint32 MaxAllowedLength,
                 bool checkSameValueZero)

{
  bool bVar1;
  BOOL BVar2;
  ulong uVar3;
  Var aValue;
  int64 nValue;
  Var aRight;
  double value_00;
  
  BVar2 = JavascriptOperators::IsUndefined(value);
  uVar3 = 0;
  if (BVar2 == 0) {
    bVar1 = TaggedInt::Is(value);
    if (bVar1) {
      uVar3 = TaggedInt::ToInt64(value);
      if (MaxAllowedLength < uVar3) {
LAB_009ffdea:
        JavascriptError::ThrowRangeError(scriptContext,errorCode,(PCWSTR)0x0);
      }
    }
    else {
      value_00 = JavascriptConversion::ToInteger(value,scriptContext);
      if ((value_00 < 0.0) || ((double)MaxAllowedLength < value_00)) goto LAB_009ffdea;
      if (checkSameValueZero) {
        aValue = JavascriptNumber::ToVarNoCheck(value_00,scriptContext);
        nValue = JavascriptConversion::ToLength(aValue,scriptContext);
        aRight = JavascriptNumber::ToVar(nValue,scriptContext);
        bVar1 = JavascriptConversion::SameValueCommon<true>(aValue,aRight);
        if (!bVar1) goto LAB_009ffdea;
      }
      uVar3 = (ulong)value_00;
    }
  }
  return (uint32)uVar3;
}

Assistant:

uint32 ArrayBuffer::ToIndex(Var value, int32 errorCode, ScriptContext *scriptContext, uint32 MaxAllowedLength, bool checkSameValueZero)
    {
        if (JavascriptOperators::IsUndefined(value))
        {
            return 0;
        }

        if (TaggedInt::Is(value))
        {
            int64 index = TaggedInt::ToInt64(value);
            if (index < 0 || index >(int64)MaxAllowedLength)
            {
                JavascriptError::ThrowRangeError(scriptContext, errorCode);
            }

            return  (uint32)index;
        }

        // Slower path

        double d = JavascriptConversion::ToInteger(value, scriptContext);
        if (d < 0.0 || d >(double)MaxAllowedLength)
        {
            JavascriptError::ThrowRangeError(scriptContext, errorCode);
        }

        if (checkSameValueZero)
        {
            Var integerIndex = JavascriptNumber::ToVarNoCheck(d, scriptContext);
            Var index = JavascriptNumber::ToVar(JavascriptConversion::ToLength(integerIndex, scriptContext), scriptContext);
            if (!JavascriptConversion::SameValueZero(integerIndex, index))
            {
                JavascriptError::ThrowRangeError(scriptContext, errorCode);
            }
        }

        return (uint32)d;
    }